

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifUtil.c
# Opt level: O3

Vec_Int_t * If_ManCollectMappingInt(If_Man_t *p)

{
  int iVar1;
  uint uVar2;
  uint *puVar3;
  Vec_Int_t *p_00;
  int *piVar4;
  int iVar5;
  ulong uVar6;
  long lVar7;
  uint Entry;
  Vec_Ptr_t *pVVar8;
  
  If_ManMarkMapping(p);
  pVVar8 = p->vObjs;
  iVar1 = pVVar8->nSize;
  p_00 = (Vec_Int_t *)malloc(0x10);
  iVar5 = 0x10;
  if (0xe < iVar1 - 1U) {
    iVar5 = iVar1;
  }
  p_00->nSize = 0;
  p_00->nCap = iVar5;
  if (iVar5 == 0) {
    piVar4 = (int *)0x0;
  }
  else {
    piVar4 = (int *)malloc((long)iVar5 << 2);
  }
  p_00->pArray = piVar4;
  if (0 < iVar1) {
    lVar7 = 0;
    do {
      puVar3 = (uint *)pVVar8->pArray[lVar7];
      if (((*puVar3 & 0xf) == 4) && (puVar3[3] != 0)) {
        uVar2 = puVar3[0x1b];
        Entry = uVar2 >> 0x18;
        Vec_IntPush(p_00,Entry);
        if (0xffffff < uVar2) {
          uVar6 = 0;
          do {
            Vec_IntPush(p_00,puVar3[uVar6 + 0x1c]);
            uVar6 = uVar6 + 1;
          } while (Entry != uVar6);
        }
        Vec_IntPush(p_00,puVar3[1]);
        pVVar8 = p->vObjs;
      }
      lVar7 = lVar7 + 1;
    } while (lVar7 < pVVar8->nSize);
  }
  return p_00;
}

Assistant:

Vec_Int_t * If_ManCollectMappingInt( If_Man_t * p )
{
    Vec_Int_t * vOrder;
    If_Cut_t * pCutBest;
    If_Obj_t * pObj;
    int i, k, nLeaves, * ppLeaves;
    If_ManMarkMapping( p );
    vOrder = Vec_IntAlloc( If_ManObjNum(p) );
    If_ManForEachObj( p, pObj, i )
        if ( If_ObjIsAnd(pObj) && pObj->nRefs )
        {
            pCutBest = If_ObjCutBest( pObj );
            nLeaves  = If_CutLeaveNum( pCutBest ); 
            ppLeaves = If_CutLeaves( pCutBest );
            // save the number of leaves, the leaves, and finally, the root
            Vec_IntPush( vOrder, nLeaves );
            for ( k = 0; k < nLeaves; k++ )
                Vec_IntPush( vOrder, ppLeaves[k] );
            Vec_IntPush( vOrder, pObj->Id );
        }
    return vOrder;
}